

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3_db_release_memory(sqlite3 *db)

{
  long lVar1;
  sqlite3_pcache *psVar2;
  long lVar3;
  long lVar4;
  
  if (db->mutex != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexEnter)(db->mutex);
  }
  sqlite3BtreeEnterAll(db);
  lVar3 = 8;
  for (lVar4 = 0; lVar4 < db->nDb; lVar4 = lVar4 + 1) {
    lVar1 = *(long *)((long)&db->aDb->zName + lVar3);
    if ((lVar1 != 0) &&
       (psVar2 = *(sqlite3_pcache **)(*(long *)(**(long **)(lVar1 + 8) + 0x110) + 0x40),
       psVar2 != (sqlite3_pcache *)0x0)) {
      (*sqlite3Config.pcache2.xShrink)(psVar2);
    }
    lVar3 = lVar3 + 0x20;
  }
  sqlite3BtreeLeaveAll(db);
  if (db->mutex != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexLeave)(db->mutex);
  }
  return 0;
}

Assistant:

SQLITE_API int sqlite3_db_release_memory(sqlite3 *db){
  int i;
  sqlite3_mutex_enter(db->mutex);
  sqlite3BtreeEnterAll(db);
  for(i=0; i<db->nDb; i++){
    Btree *pBt = db->aDb[i].pBt;
    if( pBt ){
      Pager *pPager = sqlite3BtreePager(pBt);
      sqlite3PagerShrink(pPager);
    }
  }
  sqlite3BtreeLeaveAll(db);
  sqlite3_mutex_leave(db->mutex);
  return SQLITE_OK;
}